

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O3

void CVmPack::unpack(vm_val_t *retval,char *fmt,size_t fmtlen,CVmDataSource *src)

{
  CVmObjPageEntry *this;
  undefined4 uVar1;
  undefined4 uVar2;
  vm_datatype_t *pvVar3;
  vm_val_t *pvVar4;
  uint16_t tmp;
  vm_obj_id_t vVar5;
  int iVar6;
  undefined4 extraout_var;
  ulong uVar7;
  int retcnt;
  CVmPackPos p;
  int local_9c;
  CVmPackPos local_98;
  CVmPackGroup local_80;
  
  vVar5 = CVmObjList::create(0,10);
  retval->typ = VM_OBJ;
  (retval->val).obj = vVar5;
  this = G_obj_table_X.pages_[vVar5 >> 0xc] + (vVar5 & 0xfff);
  uVar7 = (ulong)**(ushort **)((long)&this->ptr_ + 8);
  if (uVar7 != 0) {
    CVmObjList::cons_clear((CVmObjList *)this,0,uVar7 - 1);
  }
  pvVar4 = sp_;
  uVar1 = *(undefined4 *)&retval->field_0x4;
  vVar5 = (retval->val).obj;
  uVar2 = *(undefined4 *)((long)&retval->val + 4);
  pvVar3 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar3 = retval->typ;
  *(undefined4 *)&pvVar4->field_0x4 = uVar1;
  (pvVar4->val).obj = vVar5;
  *(undefined4 *)((long)&pvVar4->val + 4) = uVar2;
  local_9c = 0;
  local_98.idx = 1;
  local_80.start.idx = 1;
  local_80.parent = (CVmPackGroup *)0x0;
  local_98.p.p_ = fmt;
  local_98.len = fmtlen;
  local_80.start.p.p_ = fmt;
  local_80.start.len = fmtlen;
  local_80.ds = src;
  iVar6 = (*src->_vptr_CVmDataSource[7])(src);
  local_80.stream_ofs = CONCAT44(extraout_var,iVar6);
  local_80.cur_iter = 1;
  local_80.num_iters = 1;
  local_80.up_to_iters = 0;
  local_80.close_paren = L'\0';
  local_80.big_endian = 0;
  local_80.tilde = 0;
  local_80.pct = 0;
  unpack_group(&local_98,(CVmObjList *)this,&local_9c,&local_80,0);
  CVmPackPos::getch(&local_98);
  if (local_98.len == 0) {
    *(undefined2 *)*(char **)((long)&this->ptr_ + 8) = (undefined2)local_9c;
    sp_ = sp_ + -1;
    return;
  }
  err_throw_a(0x6b,1,0,(ulong)(uint)local_98.idx);
}

Assistant:

void CVmPack::unpack(VMG_ vm_val_t *retval, const char *fmt, size_t fmtlen,
                     CVmDataSource *src)
{
    /* 
     *   Set up a list for the return value.  We don't know how many elements
     *   we'll need, so allocate an initial chunk now and expand later as
     *   needed.  (We can't necessarily know the return size even by
     *   pre-parsing the format string, since it could have variable-size
     *   items with array counts.)  
     */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, 10));
    CVmObjList *retlst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* 
     *   since we're going to build the list iteratively, clear it out, so
     *   that it doesn't contain any uninitialized elements that the garbage
     *   collector might encounter 
     */
    retlst->cons_clear();

    /* save it on the stack for gc protection */
    G_stk->push(retval);

    /* we don't have any elements in our list yet */
    int retcnt = 0;

    /* unpack the root group */
    CVmPackPos p(fmt, fmtlen);
    CVmPackGroup root(&p, src);
    unpack_group(vmg_ &p, retlst, &retcnt, &root, FALSE);

    /* make sure we made it all the way through the format string */
    if (p.more())
        err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p.index());

    /* set the return list's final length */
    retlst->cons_set_len(retcnt);

    /* discard the gc protection */
    G_stk->discard();
}